

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::
MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
::operator()(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
            *this,Entity *e,MatrixXd *local)

{
  vector<double,_std::allocator<double>_> local_40;
  MatrixXd *local_28;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
  *this_local;
  
  local_28 = local;
  local_local = (MatrixXd *)e;
  e_local = (Entity *)this;
  this_local = (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
                *)__return_storage_ptr__;
  fe::MeshFunctionFE<double,_double>::operator()(&local_40,&this->mf_,e,local);
  internal::UnaryOpSquaredNorm::operator()
            (__return_storage_ptr__,(UnaryOpSquaredNorm *)this,&local_40,0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& local) const {
    return op_(mf_(e, local), 0);
  }